

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-arch.cpp
# Opt level: O2

string * __thiscall LLM_TN_IMPL::str_abi_cxx11_(string *__return_storage_ptr__,LLM_TN_IMPL *this)

{
  _Rb_tree<llm_tensor,_std::pair<const_llm_tensor,_const_char_*>,_std::_Select1st<std::pair<const_llm_tensor,_const_char_*>_>,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
  *this_00;
  const_iterator cVar1;
  mapped_type *pmVar2;
  mapped_type *ppcVar3;
  allocator<char> local_29;
  
  this_00 = &std::
             map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
             ::at(&LLM_TENSOR_NAMES,&this->arch)->_M_t;
  cVar1 = std::
          _Rb_tree<llm_tensor,_std::pair<const_llm_tensor,_const_char_*>,_std::_Select1st<std::pair<const_llm_tensor,_const_char_*>_>,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
          ::find(this_00,&this->tensor);
  pmVar2 = std::
           map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
           ::at(&LLM_TENSOR_NAMES,&this->arch);
  if ((_Rb_tree_header *)cVar1._M_node == &(pmVar2->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__missing__",&local_29);
  }
  else {
    pmVar2 = std::
             map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
             ::at(&LLM_TENSOR_NAMES,&this->arch);
    ppcVar3 = std::
              map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
              ::at(pmVar2,&this->tensor);
    format_abi_cxx11_(__return_storage_ptr__,*ppcVar3,(ulong)(uint)this->bid,(ulong)(uint)this->xid)
    ;
    if (this->suffix != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LLM_TN_IMPL::str() const {
    if (LLM_TENSOR_NAMES.at(arch).find(tensor) == LLM_TENSOR_NAMES.at(arch).end()) {
        return "__missing__";
    }

    std::string name = ::format(LLM_TENSOR_NAMES.at(arch).at(tensor), bid, xid);

    if (suffix != nullptr) {
        name += ".";
        name += suffix;
    }

    return name;
}